

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O1

FT_Error FT_Stroker_CubicTo(FT_Stroker stroker,FT_Vector *control1,FT_Vector *control2,FT_Vector *to
                           )

{
  FT_Vector *pFVar1;
  long lVar2;
  FT_Pos FVar3;
  bool bVar4;
  FT_Error FVar5;
  FT_Error FVar6;
  FT_Angle angle1;
  FT_Angle FVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  FT_Angle FVar11;
  FT_Angle FVar12;
  FT_Angle FVar13;
  FT_Angle FVar14;
  FT_Fixed FVar15;
  FT_Long length;
  FT_Long FVar16;
  FT_Angle FVar17;
  FT_Fixed FVar18;
  FT_Long length_00;
  long lVar19;
  ulong uVar20;
  char cVar21;
  long lVar22;
  long dx;
  long lVar23;
  long lVar24;
  long dx_00;
  long dy;
  FT_StrokeBorder border;
  long dy_00;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  FT_Pos FStack_378;
  FT_Vector bez_stack [37];
  FT_Vector bvec;
  FT_Vector delta;
  undefined1 auStack_f8 [8];
  FT_Vector start;
  FT_Vector ctrl1;
  FT_Vector ctrl2;
  FT_Angle local_a0;
  undefined1 local_88 [8];
  FT_Vector end;
  FT_Pos *local_68;
  FT_Angle local_50;
  
  FVar6 = 6;
  if ((to != (FT_Vector *)0x0 && control2 != (FT_Vector *)0x0) &&
      (control1 != (FT_Vector *)0x0 && stroker != (FT_Stroker)0x0)) {
    pFVar1 = &stroker->center;
    if (((((2 < ((stroker->center).x - control1->x) + 1U) ||
          (2 < ((stroker->center).y - control1->y) + 1U)) || (2 < (control1->x - control2->x) + 1U))
        || ((2 < (control1->y - control2->y) + 1U || (2 < (control2->x - to->x) + 1U)))) ||
       (FVar6 = 0, 2 < (control2->y - to->y) + 1U)) {
      local_68 = &FStack_378;
      FStack_378 = to->x;
      bez_stack[0].x = to->y;
      bez_stack[0].y = control2->x;
      bez_stack[1].x = control2->y;
      bez_stack[1].y = control1->x;
      bez_stack[2].x = control1->y;
      bez_stack[2].y = pFVar1->x;
      bez_stack[3].x = (stroker->center).y;
      bVar4 = true;
      FVar6 = 0;
      uVar26 = 0;
      do {
        angle1 = stroker->angle_in;
        FVar7 = angle1;
        local_50 = angle1;
        if (uVar26 < 0x200) {
          lVar25 = local_68[4];
          lVar19 = local_68[6];
          end.y = local_68[5];
          lVar22 = local_68[7];
          lVar24 = local_68[1];
          lVar23 = local_68[2];
          dx = lVar23 - lVar25;
          lVar2 = local_68[3];
          dy = lVar2 - end.y;
          lVar10 = *(long *)((long)bez_stack + (uVar26 - 8));
          dx_00 = lVar10 - lVar23;
          dy_00 = lVar24 - lVar2;
          bVar27 = 2 < dx + 1U;
          bVar28 = 2 < dy + 1U;
          bVar29 = 2 < dx_00 + 1U;
          bVar30 = 2 < dy_00 + 1U;
          if ((end.y - lVar22) + 1U < 3 && (lVar25 - lVar19) + 1U < 3) {
            if (bVar28 || bVar27) {
              angle1 = FT_Atan2(dx,dy);
              local_50 = angle1;
              FVar7 = angle1;
              if (bVar30 || bVar29) {
                local_50 = FT_Atan2(dx_00,dy_00);
              }
            }
            else if (bVar30 || bVar29) {
              angle1 = FT_Atan2(dx_00,dy_00);
              local_50 = angle1;
              FVar7 = angle1;
            }
          }
          else {
            angle1 = FT_Atan2(lVar25 - lVar19,end.y - lVar22);
            if (bVar28 || bVar27) {
              FVar7 = FT_Atan2(dx,dy);
              local_50 = FVar7;
              if (bVar30 || bVar29) {
                local_50 = FT_Atan2(dx_00,dy_00);
              }
            }
            else {
              local_50 = angle1;
              FVar7 = angle1;
              if (bVar30 || bVar29) {
                local_50 = FT_Atan2(dx_00,dy_00);
                FVar7 = FT_Angle_Diff(angle1,local_50);
                FVar7 = FVar7 / 2 + angle1;
              }
            }
          }
          uVar8 = FT_Angle_Diff(angle1,FVar7);
          uVar20 = -uVar8;
          if (0 < (long)uVar8) {
            uVar20 = uVar8;
          }
          uVar9 = FT_Angle_Diff(FVar7,local_50);
          uVar8 = -uVar9;
          if (0 < (long)uVar9) {
            uVar8 = uVar9;
          }
          if ((uVar20 < 0x168000) && (uVar8 < 0x168000)) goto LAB_001f5374;
          if (stroker->first_point != '\0') {
            stroker->angle_in = angle1;
          }
          local_68[0xc] = lVar19;
          lVar10 = (lVar10 + lVar23) / 2;
          local_68[2] = lVar10;
          lVar19 = (lVar19 + lVar25) / 2;
          local_68[10] = lVar19;
          lVar25 = (lVar23 + lVar25) / 2;
          lVar23 = (lVar10 + lVar25) / 2;
          local_68[4] = lVar23;
          lVar25 = (lVar25 + lVar19) / 2;
          local_68[8] = lVar25;
          local_68[6] = (lVar25 + lVar23) / 2;
          local_68[0xd] = lVar22;
          lVar25 = (lVar24 + lVar2) / 2;
          local_68[3] = lVar25;
          FVar3 = end.y;
          lVar19 = (lVar22 + end.y) / 2;
          local_68[0xb] = lVar19;
          lVar22 = (lVar2 + FVar3) / 2;
          lVar24 = (lVar25 + lVar22) / 2;
          local_68[5] = lVar24;
          lVar25 = (lVar22 + lVar19) / 2;
          local_68[9] = lVar25;
          local_68[7] = (lVar25 + lVar24) / 2;
          uVar26 = uVar26 + 0x30;
          cVar21 = '\x03';
        }
        else {
LAB_001f5374:
          if (bVar4) {
            if (stroker->first_point == '\0') {
              stroker->angle_out = angle1;
              FVar6 = ft_stroker_process_corner(stroker,0);
            }
            else {
              FVar6 = ft_stroker_subpath_start(stroker,angle1,0);
            }
          }
          else {
            uVar8 = FT_Angle_Diff(stroker->angle_in,angle1);
            uVar20 = -uVar8;
            if (0 < (long)uVar8) {
              uVar20 = uVar8;
            }
            if (0x5a000 < uVar20) {
              FVar3 = local_68[7];
              pFVar1->x = local_68[6];
              (stroker->center).y = FVar3;
              stroker->angle_out = angle1;
              stroker->line_join = FT_STROKER_LINEJOIN_ROUND;
              FVar6 = ft_stroker_process_corner(stroker,0);
              stroker->line_join = stroker->line_join_saved;
            }
          }
          if (FVar6 == 0) {
            FVar11 = FT_Angle_Diff(angle1,FVar7);
            FVar12 = FT_Angle_Diff(FVar7,local_50);
            FVar13 = FT_Angle_Diff(angle1,FVar7);
            FVar14 = FT_Angle_Diff(FVar7,local_50);
            FVar16 = stroker->radius;
            FVar15 = FT_Cos(FVar11 / 2);
            length = FT_DivFix(FVar16,FVar15);
            FVar16 = stroker->radius;
            FVar15 = FT_Cos(FVar12 / 2);
            FVar16 = FT_DivFix(FVar16,FVar15);
            if (stroker->handle_wide_strokes == '\0') {
              local_a0 = 0;
            }
            else {
              local_a0 = FT_Atan2(*(long *)((long)bez_stack + (uVar26 - 8)) - local_68[6],
                                  local_68[1] - local_68[7]);
            }
            lVar25 = 0;
            FVar6 = 0;
            border = stroker->borders;
            do {
              FT_Vector_From_Polar
                        ((FT_Vector *)&start.y,length,angle1 + FVar13 / 2 + 0x5a0000 + lVar25);
              start.y = start.y + local_68[4];
              ctrl1.x = ctrl1.x + local_68[5];
              FT_Vector_From_Polar
                        ((FT_Vector *)&ctrl1.y,FVar16,FVar7 + FVar14 / 2 + 0x5a0000 + lVar25);
              ctrl1.y = ctrl1.y + local_68[2];
              FT_Vector_From_Polar
                        ((FT_Vector *)local_88,stroker->radius,local_50 + 0x5a0000 + lVar25);
              lVar19 = *(long *)((long)bez_stack + (uVar26 - 8));
              local_88 = (undefined1  [8])((long)local_88 + lVar19);
              lVar22 = local_68[1];
              end.x = end.x + lVar22;
              if (stroker->handle_wide_strokes == '\0') {
LAB_001f58dc:
                FVar6 = ft_stroke_border_cubicto
                                  (border,(FT_Vector *)&start.y,(FT_Vector *)&ctrl1.y,
                                   (FT_Vector *)local_88);
                FVar5 = 0;
                if (FVar6 != 0) {
                  cVar21 = '\x02';
                  goto LAB_001f5957;
                }
              }
              else {
                lVar24 = border->points[border->num_points - 1].x;
                start.x = border->points[border->num_points - 1].y;
                auStack_f8 = (undefined1  [8])lVar24;
                end.y = start.x;
                FVar11 = FT_Atan2((long)local_88 - lVar24,end.x - start.x);
                uVar8 = FT_Angle_Diff(local_a0,FVar11);
                uVar20 = -uVar8;
                if (0 < (long)uVar8) {
                  uVar20 = uVar8;
                }
                cVar21 = '\0';
                if (0x5a0000 < uVar20) {
                  FVar12 = FT_Atan2(local_68[6] - lVar24,local_68[7] - end.y);
                  FVar17 = FT_Atan2(lVar19 - (long)local_88,lVar22 - end.x);
                  bez_stack[0x24].y = (long)local_88 - lVar24;
                  bvec.x = end.x - end.y;
                  FVar15 = FT_Vector_Length((FT_Vector *)&bez_stack[0x24].y);
                  FVar18 = FT_Sin(FVar11 - FVar17);
                  lVar19 = -FVar18;
                  if (0 < FVar18) {
                    lVar19 = FVar18;
                  }
                  FVar18 = FT_Sin(FVar12 - FVar17);
                  lVar22 = -FVar18;
                  if (0 < FVar18) {
                    lVar22 = FVar18;
                  }
                  length_00 = FT_MulDiv(FVar15,lVar19,lVar22);
                  FT_Vector_From_Polar((FT_Vector *)&bvec.y,length_00,FVar12);
                  bvec.y = bvec.y + lVar24;
                  border->movable = '\0';
                  FVar6 = ft_stroke_border_lineto(border,(FT_Vector *)&bvec.y,'\0');
                  cVar21 = '\x02';
                  if (FVar6 == 0) {
                    FVar6 = ft_stroke_border_lineto(border,(FT_Vector *)local_88,'\0');
                    if ((FVar6 == 0) &&
                       (FVar6 = ft_stroke_border_cubicto
                                          (border,(FT_Vector *)&ctrl1.y,(FT_Vector *)&start.y,
                                           (FT_Vector *)auStack_f8), FVar6 == 0)) {
                      FVar6 = ft_stroke_border_lineto(border,(FT_Vector *)local_88,'\0');
                      cVar21 = (FVar6 == 0) * '\x05' + '\x02';
                    }
                    else {
                      cVar21 = '\x02';
                    }
                  }
                }
                FVar5 = FVar6;
                if (cVar21 != '\a') {
                  if (cVar21 == '\0') goto LAB_001f58dc;
                  goto LAB_001f5957;
                }
              }
              FVar6 = FVar5;
              border = border + 1;
              lVar25 = lVar25 + -0xb40000;
            } while (lVar25 == -0xb40000);
            cVar21 = '\0';
LAB_001f5957:
            bVar4 = false;
            if (cVar21 == '\0') {
              uVar26 = uVar26 - 0x30;
              stroker->angle_in = local_50;
              cVar21 = '\0';
            }
          }
          else {
            cVar21 = '\x02';
            bVar4 = false;
          }
        }
        if ((cVar21 != '\x03') && (cVar21 != '\0')) {
          return FVar6;
        }
        local_68 = (FT_Pos *)((long)bez_stack + (uVar26 - 8));
      } while (-1 < (long)uVar26);
    }
    FVar3 = to->y;
    pFVar1->x = to->x;
    (stroker->center).y = FVar3;
  }
  return FVar6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_CubicTo( FT_Stroker  stroker,
                      FT_Vector*  control1,
                      FT_Vector*  control2,
                      FT_Vector*  to )
  {
    FT_Error    error = FT_Err_Ok;
    FT_Vector   bez_stack[37];
    FT_Vector*  arc;
    FT_Vector*  limit = bez_stack + 32;
    FT_Bool     first_arc = TRUE;


    if ( !stroker || !control1 || !control2 || !to )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* if all control points are coincident, this is a no-op; */
    /* avoid creating a spurious corner */
    if ( FT_IS_SMALL( stroker->center.x - control1->x ) &&
         FT_IS_SMALL( stroker->center.y - control1->y ) &&
         FT_IS_SMALL( control1->x       - control2->x ) &&
         FT_IS_SMALL( control1->y       - control2->y ) &&
         FT_IS_SMALL( control2->x       - to->x       ) &&
         FT_IS_SMALL( control2->y       - to->y       ) )
    {
       stroker->center = *to;
       goto Exit;
    }

    arc    = bez_stack;
    arc[0] = *to;
    arc[1] = *control2;
    arc[2] = *control1;
    arc[3] = stroker->center;

    while ( arc >= bez_stack )
    {
      FT_Angle  angle_in, angle_mid, angle_out;


      /* initialize with current direction */
      angle_in = angle_out = angle_mid = stroker->angle_in;

      if ( arc < limit                                         &&
           !ft_cubic_is_small_enough( arc, &angle_in,
                                      &angle_mid, &angle_out ) )
      {
        if ( stroker->first_point )
          stroker->angle_in = angle_in;

        ft_cubic_split( arc );
        arc += 3;
        continue;
      }

      if ( first_arc )
      {
        first_arc = FALSE;

        /* process corner if necessary */
        if ( stroker->first_point )
          error = ft_stroker_subpath_start( stroker, angle_in, 0 );
        else
        {
          stroker->angle_out = angle_in;
          error = ft_stroker_process_corner( stroker, 0 );
        }
      }
      else if ( ft_pos_abs( FT_Angle_Diff( stroker->angle_in, angle_in ) ) >
                  FT_SMALL_CUBIC_THRESHOLD / 4                             )
      {
        /* if the deviation from one arc to the next is too great, */
        /* add a round corner                                      */
        stroker->center    = arc[3];
        stroker->angle_out = angle_in;
        stroker->line_join = FT_STROKER_LINEJOIN_ROUND;

        error = ft_stroker_process_corner( stroker, 0 );

        /* reinstate line join style */
        stroker->line_join = stroker->line_join_saved;
      }

      if ( error )
        goto Exit;

      /* the arc's angle is small enough; we can add it directly to each */
      /* border                                                          */
      {
        FT_Vector        ctrl1, ctrl2, end;
        FT_Angle         theta1, phi1, theta2, phi2, rotate, alpha0 = 0;
        FT_Fixed         length1, length2;
        FT_StrokeBorder  border;
        FT_Int           side;


        theta1  = FT_Angle_Diff( angle_in,  angle_mid ) / 2;
        theta2  = FT_Angle_Diff( angle_mid, angle_out ) / 2;
        phi1    = ft_angle_mean( angle_in,  angle_mid );
        phi2    = ft_angle_mean( angle_mid, angle_out );
        length1 = FT_DivFix( stroker->radius, FT_Cos( theta1 ) );
        length2 = FT_DivFix( stroker->radius, FT_Cos( theta2 ) );

        /* compute direction of original arc */
        if ( stroker->handle_wide_strokes )
          alpha0 = FT_Atan2( arc[0].x - arc[3].x, arc[0].y - arc[3].y );

        for ( border = stroker->borders, side = 0;
              side <= 1;
              side++, border++ )
        {
          rotate = FT_SIDE_TO_ROTATE( side );

          /* compute control points */
          FT_Vector_From_Polar( &ctrl1, length1, phi1 + rotate );
          ctrl1.x += arc[2].x;
          ctrl1.y += arc[2].y;

          FT_Vector_From_Polar( &ctrl2, length2, phi2 + rotate );
          ctrl2.x += arc[1].x;
          ctrl2.y += arc[1].y;

          /* compute end point */
          FT_Vector_From_Polar( &end, stroker->radius, angle_out + rotate );
          end.x += arc[0].x;
          end.y += arc[0].y;

          if ( stroker->handle_wide_strokes )
          {
            FT_Vector  start;
            FT_Angle   alpha1;


            /* determine whether the border radius is greater than the */
            /* radius of curvature of the original arc                 */
            start = border->points[border->num_points - 1];

            alpha1 = FT_Atan2( end.x - start.x, end.y - start.y );

            /* is the direction of the border arc opposite to */
            /* that of the original arc? */
            if ( ft_pos_abs( FT_Angle_Diff( alpha0, alpha1 ) ) >
                   FT_ANGLE_PI / 2                             )
            {
              FT_Angle   beta, gamma;
              FT_Vector  bvec, delta;
              FT_Fixed   blen, sinA, sinB, alen;


              /* use the sine rule to find the intersection point */
              beta  = FT_Atan2( arc[3].x - start.x, arc[3].y - start.y );
              gamma = FT_Atan2( arc[0].x - end.x,   arc[0].y - end.y );

              bvec.x = end.x - start.x;
              bvec.y = end.y - start.y;

              blen = FT_Vector_Length( &bvec );

              sinA = ft_pos_abs( FT_Sin( alpha1 - gamma ) );
              sinB = ft_pos_abs( FT_Sin( beta - gamma ) );

              alen = FT_MulDiv( blen, sinA, sinB );

              FT_Vector_From_Polar( &delta, alen, beta );
              delta.x += start.x;
              delta.y += start.y;

              /* circumnavigate the negative sector backwards */
              border->movable = FALSE;
              error = ft_stroke_border_lineto( border, &delta, FALSE );
              if ( error )
                goto Exit;
              error = ft_stroke_border_lineto( border, &end, FALSE );
              if ( error )
                goto Exit;
              error = ft_stroke_border_cubicto( border,
                                                &ctrl2,
                                                &ctrl1,
                                                &start );
              if ( error )
                goto Exit;
              /* and then move to the endpoint */
              error = ft_stroke_border_lineto( border, &end, FALSE );
              if ( error )
                goto Exit;

              continue;
            }

            /* else fall through */
          }

          /* simply add an arc */
          error = ft_stroke_border_cubicto( border, &ctrl1, &ctrl2, &end );
          if ( error )
            goto Exit;
        }
      }

      arc -= 3;

      stroker->angle_in = angle_out;
    }

    stroker->center = *to;

  Exit:
    return error;
  }